

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

StackSym * __thiscall StackSym::GetTypeEquivSym(StackSym *this,IRType type,Func *func)

{
  SymID id;
  RegSlot byteCodeRegSlot;
  StackSym *pSVar1;
  Func *func_00;
  
  pSVar1 = GetTypeEquivSym_NoCreate(this,type);
  if (pSVar1 == (StackSym *)0x0) {
    if (func == (Func *)0x0) {
      pSVar1 = (StackSym *)0x0;
    }
    else {
      if ((this->field_0x19 & 0x20) == 0) {
        pSVar1 = New(type,func);
      }
      else {
        id = SymTable::NewID(func->m_symTable);
        byteCodeRegSlot = GetByteCodeRegSlot(this);
        func_00 = GetByteCodeFunc(this);
        pSVar1 = New(id,type,byteCodeRegSlot,func_00);
      }
      pSVar1->m_equivNext = this->m_equivNext;
      this->m_equivNext = pSVar1;
      if (type != TyVar) {
        pSVar1->field_0x1a = pSVar1->field_0x1a | 1;
      }
    }
  }
  return pSVar1;
}

Assistant:

StackSym *
StackSym::GetTypeEquivSym(IRType type, Func *func)
{
    StackSym *sym = this->GetTypeEquivSym_NoCreate(type);

    if (sym != nullptr)
    {
        return sym;
    }

    // Don't allocate if func wasn't passed in.
    if (func == nullptr)
    {
        return nullptr;
    }

    if (this->HasByteCodeRegSlot())
    {
        sym = StackSym::New(func->m_symTable->NewID(), type,
            this->GetByteCodeRegSlot(), this->GetByteCodeFunc());
    }
    else
    {
        sym = StackSym::New(type, func);
    }
    sym->m_equivNext = this->m_equivNext;
    this->m_equivNext = sym;
    if (type != TyVar)
    {
        sym->m_isTypeSpec = true;
    }

    return sym;
}